

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmCore.c
# Opt level: O0

Gia_Man_t * Mpm_ManPerformLutMapping(Mig_Man_t *pMig,Mpm_Par_t *pPars)

{
  Mpm_Man_t *p_00;
  Gia_Man_t *pGVar1;
  Mpm_Man_t *p;
  Gia_Man_t *pNew;
  Mpm_Par_t *pPars_local;
  Mig_Man_t *pMig_local;
  
  p_00 = Mpm_ManStart(pMig,pPars);
  if (p_00->pPars->fVerbose != 0) {
    Mpm_ManPrintStatsInit(p_00);
  }
  Mpm_ManPrepare(p_00);
  Mpm_ManPerform(p_00);
  if (p_00->pPars->fVerbose != 0) {
    Mpm_ManPrintStats(p_00);
  }
  pGVar1 = (Gia_Man_t *)Mpm_ManFromIfLogic(p_00);
  Mpm_ManStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Mpm_ManPerformLutMapping( Mig_Man_t * pMig, Mpm_Par_t * pPars )
{
    Gia_Man_t * pNew;
    Mpm_Man_t * p;
    p = Mpm_ManStart( pMig, pPars );
    if ( p->pPars->fVerbose ) 
        Mpm_ManPrintStatsInit( p );
    Mpm_ManPrepare( p );
    Mpm_ManPerform( p );
    if ( p->pPars->fVerbose ) 
        Mpm_ManPrintStats( p );
    pNew = (Gia_Man_t *)Mpm_ManFromIfLogic( p );
    Mpm_ManStop( p );
    return pNew;
}